

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void __thiscall luna::String::SetValue(String *this,char *str,size_t len)

{
  anon_union_16_2_eed97686_for_String_2 *s;
  
  if (((this->super_GCObject).field_0x11 != '\0') && ((this->field_1).str_ != (char *)0x0)) {
    operator_delete__((this->field_1).str_);
  }
  this->length_ = (uint)len;
  if (10 < len) {
    s = (anon_union_16_2_eed97686_for_String_2 *)operator_new__(len + 1);
    (this->field_1).str_ = (char *)s;
    memcpy(s,str,len);
  }
  else {
    s = &this->field_1;
    memcpy(s,str,len);
  }
  s->str_buffer_[len] = '\0';
  (this->super_GCObject).field_0x11 = 10 < len;
  Hash(this,s->str_buffer_);
  return;
}

Assistant:

void String::SetValue(const char *str, std::size_t len)
    {
        if (in_heap_)
            delete [] str_;

        length_ = len;
        if (len < sizeof(str_buffer_))
        {
            memcpy(str_buffer_, str, len);
            str_buffer_[len] = 0;
            in_heap_ = 0;
            Hash(str_buffer_);
        }
        else
        {
            str_ = new char[len + 1];
            memcpy(str_, str, len);
            str_[len] = 0;
            in_heap_ = 1;
            Hash(str_);
        }
    }